

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O2

void __thiscall
DumpMetaArrayVal<signed_char>::operator()
          (DumpMetaArrayVal<signed_char> *this,PtexMetaData *meta,char *key)

{
  ostream *poVar1;
  ulong uVar2;
  int count;
  char *val;
  
  val = (char *)0x0;
  (*meta->_vptr_PtexMetaData[8])(meta,key,&val);
  uVar2 = 0;
  while( true ) {
    if (-1 < (long)uVar2) break;
    if (((int)((uVar2 & 0xffffffff) / 10) * -10 + (int)uVar2 == 0) && (uVar2 != 0)) {
      std::operator<<((ostream *)&std::cout,"\n  ");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"  ");
    std::operator<<(poVar1,val[uVar2]);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void operator()(PtexMetaData* meta, const char* key)
    {
        const T* val=0;
        int count=0;
        meta->getValue(key, val, count);
        for (int i = 0; i < count; i++) {
            if (i%10==0 && (i || count > 10)) std::cout << "\n  ";
            std::cout <<  "  " << val[i];
        }
    }